

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O3

wchar_t archive_match_free(archive *_a)

{
  void *pvVar1;
  void *__ptr;
  wchar_t wVar2;
  int iVar3;
  
  wVar2 = L'\0';
  if (_a != (archive *)0x0) {
    iVar3 = __archive_check_magic(_a,0xcad11c9,0xffff,"archive_match_free");
    wVar2 = L'\xffffffe2';
    if (iVar3 != -0x1e) {
      match_list_free(*(match_list **)&_a[1].file_count);
      match_list_free((match_list *)_a[1].vtable);
      __ptr = *(void **)&_a[2].current_codepage;
      while (__ptr != (void *)0x0) {
        pvVar1 = *(void **)((long)__ptr + 0x18);
        archive_mstring_clean((archive_mstring *)((long)__ptr + 0x20));
        free(__ptr);
        __ptr = pvVar1;
      }
      free(_a[3].archive_format_name);
      free(*(void **)&_a[3].file_count);
      match_list_free((match_list *)_a[3].error);
      match_list_free(*(match_list **)&_a[3].current_codepage);
      free(_a);
      wVar2 = L'\0';
    }
  }
  return wVar2;
}

Assistant:

int
archive_match_free(struct archive *_a)
{
	struct archive_match *a;

	if (_a == NULL)
		return (ARCHIVE_OK);
	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_ANY | ARCHIVE_STATE_FATAL, "archive_match_free");
	a = (struct archive_match *)_a;
	match_list_free(&(a->inclusions));
	match_list_free(&(a->exclusions));
	entry_list_free(&(a->exclusion_entry_list));
	free(a->inclusion_uids.ids);
	free(a->inclusion_gids.ids);
	match_list_free(&(a->inclusion_unames));
	match_list_free(&(a->inclusion_gnames));
	free(a);
	return (ARCHIVE_OK);
}